

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

void __thiscall
QMetaMethodBuilderPrivate::QMetaMethodBuilderPrivate
          (QMetaMethodBuilderPrivate *this,MethodType _methodType,QByteArray *_signature,
          QByteArray *_returnType,Access _access,int _revision)

{
  char *pcVar1;
  
  pcVar1 = (_signature->d).ptr;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "";
  }
  QMetaObject::normalizedSignature(&this->signature,pcVar1);
  pcVar1 = (_returnType->d).ptr;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "";
  }
  QMetaObject::normalizedType(&this->returnType,pcVar1);
  (this->tag).d.ptr = (char *)0x0;
  (this->tag).d.size = 0;
  (this->parameterNames).d.size = 0;
  (this->tag).d.d = (Data *)0x0;
  (this->parameterNames).d.d = (Data *)0x0;
  (this->parameterNames).d.ptr = (QByteArray *)0x0;
  this->attributes = _methodType << 2 | _access;
  this->revision = _revision;
  return;
}

Assistant:

QMetaMethodBuilderPrivate
            (QMetaMethod::MethodType _methodType,
             const QByteArray& _signature,
             const QByteArray& _returnType = QByteArray("void"),
             QMetaMethod::Access _access = QMetaMethod::Public,
             int _revision = 0)
        : signature(QMetaObject::normalizedSignature(_signature.constData())),
          returnType(QMetaObject::normalizedType(_returnType)),
          attributes(((int)_access) | (((int)_methodType) << 2)),
          revision(_revision)
    {
        Q_ASSERT((_methodType == QMetaMethod::Constructor) == returnType.isNull());
    }